

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

float ImGui::CalcWrapWidthForPos(ImVec2 *pos,float wrap_pos_x)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *window;
  float fVar2;
  
  fVar2 = 0.0;
  if (0.0 <= wrap_pos_x) {
    pIVar1 = GImGui->CurrentWindow;
    if ((wrap_pos_x != 0.0) || (NAN(wrap_pos_x))) {
      if (0.0 < wrap_pos_x) {
        wrap_pos_x = wrap_pos_x + ((pIVar1->Pos).x - (pIVar1->Scroll).x);
      }
    }
    else {
      fVar2 = (pIVar1->ContentsRegionRect).Max.x;
      if ((pIVar1->DC).ColumnsCount != 1) {
        fVar2 = GetColumnOffset((pIVar1->DC).ColumnsCurrent + 1);
        fVar2 = fVar2 - (pIVar1->WindowPadding).x;
      }
      wrap_pos_x = fVar2 + (pIVar1->Pos).x;
    }
    fVar2 = wrap_pos_x - pos->x;
    if (fVar2 <= 1.0) {
      fVar2 = 1.0;
    }
  }
  return fVar2;
}

Assistant:

float ImGui::CalcWrapWidthForPos(const ImVec2& pos, float wrap_pos_x)
{
    if (wrap_pos_x < 0.0f)
        return 0.0f;

    ImGuiWindow* window = GetCurrentWindowRead();
    if (wrap_pos_x == 0.0f)
        wrap_pos_x = GetContentRegionMax().x + window->Pos.x;
    else if (wrap_pos_x > 0.0f)
        wrap_pos_x += window->Pos.x - window->Scroll.x; // wrap_pos_x is provided is window local space

    return ImMax(wrap_pos_x - pos.x, 1.0f);
}